

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_inv_gen(REF_INT n,REF_DBL *orig,REF_DBL *inv)

{
  ulong uVar1;
  long lVar2;
  undefined8 uVar3;
  double dVar4;
  REF_STATUS RVar5;
  void *__ptr;
  int iVar6;
  ulong uVar7;
  REF_DBL *pRVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  void *pvVar12;
  REF_DBL *pRVar13;
  ulong uVar14;
  long lVar15;
  void *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  REF_DBL *local_60;
  void *local_58;
  
  __ptr = malloc((ulong)(uint)(n * n) << 3);
  if (__ptr == (void *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_matrix.c",0x48b,
           "ref_matrix_inv_gen","malloc a of REF_DBL NULL");
    RVar5 = 2;
  }
  else {
    uVar7 = (ulong)(uint)n;
    if (0 < n) {
      uVar14 = 0;
      uVar18 = uVar7;
      do {
        memcpy((void *)((long)__ptr + uVar14 * 8),orig + uVar14,uVar7 * 8);
        uVar14 = (ulong)(uint)((int)uVar14 + n);
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    if (0 < n) {
      uVar14 = 0;
      uVar18 = uVar7;
      do {
        memset(inv + uVar14,0,uVar7 * 8);
        uVar14 = (ulong)(uint)((int)uVar14 + n);
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    if (0 < n) {
      iVar6 = 0;
      uVar18 = uVar7;
      do {
        inv[iVar6] = 1.0;
        iVar6 = iVar6 + n + 1;
        uVar18 = uVar18 - 1;
      } while (uVar18 != 0);
    }
    if (0 < n) {
      lVar2 = uVar7 * 8;
      local_60 = inv + 1;
      uVar14 = 1;
      uVar17 = 0;
      pvVar12 = __ptr;
      pRVar13 = inv;
      uVar18 = 0;
      local_58 = __ptr;
      do {
        local_58 = (void *)((long)local_58 + 8);
        uVar1 = uVar18 + 1;
        uVar11 = uVar18 & 0xffffffff;
        if (uVar1 < uVar7) {
          uVar11 = uVar18 & 0xffffffff;
          uVar10 = uVar14;
          do {
            dVar20 = *(double *)((long)__ptr + uVar10 * 8 + uVar17 * 8);
            if (dVar20 <= -dVar20) {
              dVar20 = -dVar20;
            }
            dVar21 = *(double *)((long)__ptr + (long)(int)uVar11 * 8 + uVar18 * uVar7 * 8);
            if (dVar21 <= -dVar21) {
              dVar21 = -dVar21;
            }
            uVar19 = uVar10 & 0xffffffff;
            if (dVar20 <= dVar21) {
              uVar19 = uVar11;
            }
            uVar11 = uVar19;
            uVar10 = uVar10 + 1;
          } while (uVar7 != uVar10);
        }
        if (uVar18 != uVar11) {
          lVar9 = (long)(int)uVar11;
          lVar15 = 0;
          uVar11 = uVar7;
          do {
            uVar3 = *(undefined8 *)((long)pvVar12 + lVar15);
            *(undefined8 *)((long)pvVar12 + lVar15) =
                 *(undefined8 *)((long)__ptr + lVar15 + lVar9 * 8);
            *(undefined8 *)((long)__ptr + lVar15 + lVar9 * 8) = uVar3;
            uVar3 = *(undefined8 *)((long)pRVar13 + lVar15);
            *(undefined8 *)((long)pRVar13 + lVar15) =
                 *(undefined8 *)((long)inv + lVar15 + lVar9 * 8);
            *(undefined8 *)((long)inv + lVar15 + lVar9 * 8) = uVar3;
            lVar15 = lVar15 + lVar2;
            uVar11 = uVar11 - 1;
          } while (uVar11 != 0);
        }
        uVar11 = (ulong)(uint)((int)uVar18 + (int)uVar18 * n);
        dVar20 = *(double *)((long)__ptr + uVar11 * 8);
        dVar21 = dVar20 * 1e+20;
        if (dVar21 <= -dVar21) {
          dVar21 = -dVar21;
        }
        lVar9 = 0;
        uVar10 = uVar7;
        do {
          dVar4 = *(double *)((long)pvVar12 + lVar9);
          dVar22 = dVar4;
          if (dVar4 <= -dVar4) {
            dVar22 = -dVar4;
          }
          if (dVar21 <= dVar22) goto LAB_00177bf7;
          *(double *)((long)pvVar12 + lVar9) = dVar4 / dVar20;
          dVar4 = *(double *)((long)pRVar13 + lVar9);
          dVar22 = dVar4;
          if (dVar4 <= -dVar4) {
            dVar22 = -dVar4;
          }
          if (dVar21 <= dVar22) goto LAB_00177bf7;
          *(double *)((long)pRVar13 + lVar9) = dVar4 / dVar20;
          lVar9 = lVar9 + lVar2;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        if (uVar1 < uVar7) {
          pRVar8 = local_60;
          uVar10 = uVar14;
          pvVar16 = local_58;
          do {
            dVar20 = *(double *)((long)__ptr + uVar11 * 8);
            dVar21 = dVar20 * 1e+20;
            if (dVar21 <= -dVar21) {
              dVar21 = -dVar21;
            }
            dVar4 = *(double *)((long)__ptr + uVar10 * 8 + (uVar18 * uVar7 & 0xffffffff) * 8);
            dVar22 = dVar4;
            if (dVar4 <= -dVar4) {
              dVar22 = -dVar4;
            }
            if (dVar21 <= dVar22) goto LAB_00177bf7;
            dVar20 = -(dVar4 / dVar20);
            lVar9 = 0;
            uVar19 = uVar7;
            do {
              *(double *)((long)pvVar16 + lVar9) =
                   *(double *)((long)pvVar12 + lVar9) * dVar20 + *(double *)((long)pvVar16 + lVar9);
              lVar9 = lVar9 + lVar2;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            lVar9 = 0;
            uVar19 = uVar7;
            do {
              *(double *)((long)pRVar8 + lVar9) =
                   *(double *)((long)pRVar13 + lVar9) * dVar20 + *(double *)((long)pRVar8 + lVar9);
              lVar9 = lVar9 + lVar2;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            uVar10 = uVar10 + 1;
            pvVar16 = (void *)((long)pvVar16 + 8);
            pRVar8 = pRVar8 + 1;
          } while (uVar10 != uVar7);
        }
        if (uVar18 != 0) {
          uVar10 = 0;
          pRVar8 = inv;
          pvVar16 = __ptr;
          do {
            dVar20 = *(double *)((long)__ptr + uVar11 * 8);
            dVar21 = dVar20 * 1e+20;
            if (dVar21 <= -dVar21) {
              dVar21 = -dVar21;
            }
            dVar4 = *(double *)((long)__ptr + uVar10 * 8 + (uVar18 * uVar7 & 0xffffffff) * 8);
            dVar22 = dVar4;
            if (dVar4 <= -dVar4) {
              dVar22 = -dVar4;
            }
            if (dVar21 <= dVar22) {
LAB_00177bf7:
              free(__ptr);
              return 4;
            }
            dVar20 = -(dVar4 / dVar20);
            lVar9 = 0;
            uVar19 = uVar7;
            do {
              *(double *)((long)pvVar16 + lVar9) =
                   *(double *)((long)pvVar12 + lVar9) * dVar20 + *(double *)((long)pvVar16 + lVar9);
              lVar9 = lVar9 + lVar2;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            lVar9 = 0;
            uVar19 = uVar7;
            do {
              *(double *)((long)pRVar8 + lVar9) =
                   *(double *)((long)pRVar13 + lVar9) * dVar20 + *(double *)((long)pRVar8 + lVar9);
              lVar9 = lVar9 + lVar2;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            uVar10 = uVar10 + 1;
            pvVar16 = (void *)((long)pvVar16 + 8);
            pRVar8 = pRVar8 + 1;
          } while (uVar10 != uVar18);
        }
        uVar14 = uVar14 + 1;
        uVar17 = (ulong)(uint)((int)uVar17 + n);
        pRVar13 = pRVar13 + 1;
        pvVar12 = (void *)((long)pvVar12 + 8);
        local_60 = local_60 + 1;
        uVar18 = uVar1;
      } while (uVar1 != uVar7);
    }
    free(__ptr);
    RVar5 = 0;
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_inv_gen(REF_INT n, REF_DBL *orig, REF_DBL *inv) {
  REF_INT i, j, k, best;
  REF_DBL *a;
  REF_DBL pivot, scale, temp;

  ref_malloc(a, n * n, REF_DBL);

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) a[i + n * j] = orig[i + n * j];

  for (j = 0; j < n; j++)
    for (i = 0; i < n; i++) inv[i + n * j] = 0.0;
  for (i = 0; i < n; i++) inv[i + n * i] = 1.0;

  for (j = 0; j < n; j++) {
    /* find the best lower row */
    best = j;
    for (k = j + 1; k < n; k++)
      if (ABS(a[k + n * j]) > ABS(a[best + n * j])) best = k;

    if (best != j) /* if there is a better row then swap */
    {
      for (k = 0; k < n; k++) {
        temp = a[j + n * k];
        a[j + n * k] = a[best + n * k];
        a[best + n * k] = temp;
        temp = inv[j + n * k];
        inv[j + n * k] = inv[best + n * k];
        inv[best + n * k] = temp;
      }
    }

    /* scale row so a[j+n*j] is 1.0 */
    pivot = a[j + n * j];
    for (k = 0; k < n; k++) {
      if (!ref_math_divisible(a[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      a[j + k * n] /= pivot;
      if (!ref_math_divisible(inv[j + k * n], pivot)) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      inv[j + k * n] /= pivot;
    }

    /* eliminate lower triangle */
    for (i = j + 1; i < n; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }

    /* eliminate upper triangle */
    for (i = 0; i < j; i++) {
      if (!ref_math_divisible(a[i + j * n], a[j + j * n])) {
        ref_free(a);
        return REF_DIV_ZERO;
      }
      scale = a[i + j * n] / a[j + j * n];
      for (k = 0; k < n; k++) a[i + k * n] -= scale * a[j + k * n];
      for (k = 0; k < n; k++) inv[i + k * n] -= scale * inv[j + k * n];
    }
  }

  ref_free(a);
  return REF_SUCCESS;
}